

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O0

HighsModelStatus * __thiscall Highs::getModelStatus(Highs *this,bool param_2)

{
  byte in_SIL;
  long in_RDI;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  Highs *in_stack_ffffffffffffffa0;
  allocator local_31;
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"getModelStatus(const bool scaled_model)",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff98,"getModelStatus()",
             (allocator *)&stack0xffffffffffffff97);
  deprecationMessage(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return (HighsModelStatus *)(in_RDI + 0x1244);
}

Assistant:

const HighsModelStatus& Highs::getModelStatus(const bool) const {
  deprecationMessage("getModelStatus(const bool scaled_model)",
                     "getModelStatus()");
  return model_status_;
}